

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

SUNErrCode SUNHashMap_New(int max_size,SUNHashMap *map)

{
  void *pvVar1;
  long *in_RSI;
  int in_EDI;
  int i;
  undefined4 local_14;
  undefined4 local_4;
  
  if (in_EDI < 1) {
    local_4 = -0x270d;
  }
  else {
    *in_RSI = 0;
    pvVar1 = malloc(0x10);
    *in_RSI = (long)pvVar1;
    if (in_RSI == (long *)0x0) {
      local_4 = -0x2704;
    }
    else {
      *(undefined4 *)*in_RSI = 0;
      *(int *)(*in_RSI + 4) = in_EDI;
      *(undefined8 *)(*in_RSI + 8) = 0;
      pvVar1 = malloc((long)in_EDI << 3);
      *(void **)(*in_RSI + 8) = pvVar1;
      if (*(long *)(*in_RSI + 8) == 0) {
        free((void *)*in_RSI);
        local_4 = -0x2704;
      }
      else {
        for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
          *(undefined8 *)(*(long *)(*in_RSI + 8) + (long)local_14 * 8) = 0;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNHashMap_New(int max_size, SUNHashMap* map)
{
  int i;

  if (max_size <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  (*map)->size     = 0;
  (*map)->max_size = max_size;

  (*map)->buckets = NULL;
  (*map)->buckets =
    (SUNHashMapKeyValue*)malloc(max_size * sizeof(*((*map)->buckets)));

  if (!(*map)->buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (i = 0; i < max_size; i++) { (*map)->buckets[i] = NULL; }

  return SUN_SUCCESS;
}